

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InlineCache.cpp
# Opt level: O2

bool __thiscall
Js::InlineCache::ConfirmCacheMiss(InlineCache *this,Type *oldType,PropertyValueInfo *info)

{
  Type *pTVar1;
  bool bVar2;
  
  if (((this->u).local.type == oldType) ||
     (pTVar1 = (this->u).local.typeWithoutProperty, pTVar1 == oldType)) {
    bVar2 = false;
  }
  else {
    bVar2 = true;
    if ((info != (PropertyValueInfo *)0x0) && ((Type *)(this->u).proto.prototypeObject == oldType))
    {
      bVar2 = ((ushort)((ulong)pTVar1 >> 1) & 3) != (short)(char)info->flags;
    }
  }
  return bVar2;
}

Assistant:

bool InlineCache::ConfirmCacheMiss(const Type * oldType, const PropertyValueInfo* info) const
    {
        return u.local.type != oldType
            && u.proto.type != oldType
            && (u.accessor.type != oldType || info == NULL || u.accessor.flags != info->GetFlags());
    }